

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

type __thiscall
robin_hood::detail::
Table<true,80ul,Rml::PropertyId,Rml::Property,robin_hood::hash<Rml::PropertyId,void>,std::equal_to<Rml::PropertyId>>
::doCreateByKey<Rml::PropertyId_const&,Rml::Property>
          (Table<true,80ul,Rml::PropertyId,Rml::Property,robin_hood::hash<Rml::PropertyId,void>,std::equal_to<Rml::PropertyId>>
           *this,PropertyId *key)

{
  int iVar1;
  long lVar2;
  InfoType IVar3;
  size_t insertion_idx;
  uint uVar4;
  uint uVar5;
  long lVar6;
  pair<Rml::PropertyId,_Rml::Property> *this_00;
  long lVar7;
  InfoType info;
  size_t idx;
  InfoType local_9c;
  size_t local_98;
  PropertyId *local_90;
  PropertyId *local_88;
  Property local_80;
  
  while( true ) {
    local_98 = 0;
    local_9c = 0;
    keyToIdx<Rml::PropertyId_const&>(this,key,&local_98,&local_9c);
    Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
    ::nextWhileLess((Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                     *)this,&local_9c,&local_98);
    lVar2 = *(long *)this;
    iVar1 = *(int *)(this + 0x28);
    lVar7 = local_98 * 0x58 + 8;
    for (; insertion_idx = local_98, IVar3 = local_9c,
        local_9c == *(byte *)(*(long *)(this + 8) + local_98); local_9c = local_9c + iVar1) {
      if (*key == *(PropertyId *)(lVar2 + -8 + lVar7)) goto LAB_002af5f2;
      local_98 = local_98 + 1;
      lVar7 = lVar7 + 0x58;
    }
    if (*(ulong *)(this + 0x10) < *(ulong *)(this + 0x20)) break;
    Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
    ::increase_size((Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                     *)this);
  }
  if (0xff < iVar1 + local_9c) {
    *(undefined8 *)(this + 0x20) = 0;
  }
  lVar6 = 0;
  uVar4 = iVar1 + local_9c;
  for (; uVar5 = uVar4, *(char *)(*(long *)(this + 8) + local_98) != '\0'; local_98 = local_98 + 1)
  {
    lVar6 = lVar6 + -1;
    uVar4 = uVar5 + iVar1;
    local_9c = uVar5;
  }
  this_00 = (pair<Rml::PropertyId,_Rml::Property> *)(lVar2 + lVar7 + -8);
  if (lVar6 == 0) {
    local_88 = key;
    pair<Rml::PropertyId,Rml::Property>::pair<Rml::PropertyId_const&>
              ((pair<Rml::PropertyId,Rml::Property> *)this_00);
  }
  else {
    Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
    ::shiftUp((Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
               *)this,local_98,insertion_idx);
    local_90 = key;
    pair<Rml::PropertyId,Rml::Property>::pair<Rml::PropertyId_const&>
              ((pair<Rml::PropertyId,Rml::Property> *)&local_88);
    pair<Rml::PropertyId,_Rml::Property>::operator=
              (this_00,(pair<Rml::PropertyId,_Rml::Property> *)&local_88);
    Rml::Property::~Property(&local_80);
  }
  *(char *)(*(long *)(this + 8) + insertion_idx) = (char)IVar3;
  *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  lVar2 = *(long *)this;
LAB_002af5f2:
  return (type)(lVar7 + lVar2);
}

Assistant:

typename std::enable_if<!std::is_void<Q>::value, Q&>::type doCreateByKey(Arg&& key) {
        while (true) {
            size_t idx{};
            InfoType info{};
            keyToIdx(key, &idx, &info);
            nextWhileLess(&info, &idx);

            // while we potentially have a match. Can't do a do-while here because when mInfo is
            // 0 we don't want to skip forward
            while (info == mInfo[idx]) {
                if (WKeyEqual::operator()(key, mKeyVals[idx].getFirst())) {
                    // key already exists, do not insert.
                    return mKeyVals[idx].getSecond();
                }
                next(&info, &idx);
            }

            // unlikely that this evaluates to true
            if (ROBIN_HOOD_UNLIKELY(mNumElements >= mMaxNumElementsAllowed)) {
                increase_size();
                continue;
            }

            // key not found, so we are now exactly where we want to insert it.
            auto const insertion_idx = idx;
            auto const insertion_info = info;
            if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }

            // find an empty spot
            while (0 != mInfo[idx]) {
                next(&info, &idx);
            }

            auto& l = mKeyVals[insertion_idx];
            if (idx == insertion_idx) {
                // put at empty spot. This forwards all arguments into the node where the object
                // is constructed exactly where it is needed.
                ::new (static_cast<void*>(&l))
                    Node(*this, std::piecewise_construct,
                         std::forward_as_tuple(std::forward<Arg>(key)), std::forward_as_tuple());
            } else {
                shiftUp(idx, insertion_idx);
                l = Node(*this, std::piecewise_construct,
                         std::forward_as_tuple(std::forward<Arg>(key)), std::forward_as_tuple());
            }

            // mKeyVals[idx].getFirst() = std::move(key);
            mInfo[insertion_idx] = static_cast<uint8_t>(insertion_info);

            ++mNumElements;
            return mKeyVals[insertion_idx].getSecond();
        }
    }